

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O0

bool __thiscall
cmQtAutoGen::RccLister::list
          (RccLister *this,string *qrcFile,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,string *error,bool verbose)

{
  string *this_00;
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  streambuf *psVar4;
  string local_5a0;
  reference local_580;
  string *entry;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_540 [32];
  ostringstream local_520 [8];
  ostringstream osst;
  long local_3a8;
  ifstream ifs;
  undefined1 local_1a0 [8];
  string qrcContents;
  string local_178;
  rep local_158;
  string local_150;
  allocator<char> local_129;
  undefined1 local_128 [8];
  string msg;
  undefined1 local_e8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmd;
  string rccStdErr;
  string rccStdOut;
  int retVal;
  bool result;
  string fileDir;
  string local_58;
  byte local_31;
  string *psStack_30;
  bool verbose_local;
  string *error_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  string *qrcFile_local;
  RccLister *this_local;
  
  local_31 = verbose;
  psStack_30 = error;
  error_local = (string *)files;
  files_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)qrcFile;
  qrcFile_local = &this->RccExcutable_;
  std::__cxx11::string::clear();
  bVar1 = cmsys::SystemTools::FileExists((string *)files_local,true);
  if (bVar1) {
    cmsys::SystemTools::GetFilenamePath((string *)&retVal,(string *)files_local);
    uVar2 = std::__cxx11::string::empty();
    if ((((uVar2 & 1) != 0) ||
        (bVar1 = cmsys::SystemTools::FileExists(&this->RccExcutable_,true), !bVar1)) ||
       (bVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(&this->ListOptions_), bVar1)) {
      std::__cxx11::string::string((string *)local_1a0);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::ifstream::ifstream(&local_3a8,pcVar3,_S_in);
      bVar1 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&local_3a8 + *(long *)(local_3a8 + -0x18)));
      if (bVar1) {
        std::__cxx11::ostringstream::ostringstream(local_520);
        psVar4 = (streambuf *)std::ifstream::rdbuf();
        std::ostream::operator<<(local_520,psVar4);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=((string *)local_1a0,local_540);
        std::__cxx11::string::~string(local_540);
        std::__cxx11::ostringstream::~ostringstream(local_520);
      }
      else {
        std::__cxx11::string::operator=((string *)psStack_30,"The resource file ");
        Quoted((string *)&__range1,(string *)files_local);
        std::__cxx11::string::operator+=((string *)psStack_30,(string *)&__range1);
        std::__cxx11::string::~string((string *)&__range1);
        std::__cxx11::string::operator+=((string *)psStack_30," is not readable\n");
        this_local._7_1_ = 0;
      }
      qrcContents.field_2._13_3_ = 0;
      qrcContents.field_2._M_local_buf[0xc] = !bVar1;
      std::ifstream::~ifstream(&local_3a8);
      if (qrcContents.field_2._12_4_ == 0) {
        RccListParseContent((string *)local_1a0,
                            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)error_local);
        qrcContents.field_2._12_4_ = 0;
      }
      std::__cxx11::string::~string((string *)local_1a0);
      this_00 = error_local;
    }
    else {
      rccStdOut.field_2._M_local_buf[0xf] = '\0';
      rccStdOut.field_2._8_4_ = 0;
      std::__cxx11::string::string((string *)(rccStdErr.field_2._M_local_buf + 8));
      std::__cxx11::string::string
                ((string *)
                 &cmd.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_e8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_e8,
                 &this->RccExcutable_);
      cmAppend<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_e8,&this->ListOptions_);
      cmsys::SystemTools::GetFilenameName((string *)((long)&msg.field_2 + 8),(string *)files_local);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&msg.field_2 + 8));
      std::__cxx11::string::~string((string *)(msg.field_2._M_local_buf + 8));
      if ((local_31 & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_128,"Running command:\n",&local_129);
        std::allocator<char>::~allocator(&local_129);
        QuotedCommand(&local_150,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_e8);
        std::__cxx11::string::operator+=((string *)local_128,(string *)&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::operator+=((string *)local_128,'\n');
        cmSystemTools::Stdout((string *)local_128);
        std::__cxx11::string::~string((string *)local_128);
      }
      pcVar3 = (char *)std::__cxx11::string::c_str();
      local_158 = (rep)std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
      rccStdOut.field_2._M_local_buf[0xf] =
           cmSystemTools::RunSingleCommand
                     ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_e8,(string *)((long)&rccStdErr.field_2 + 8),
                      (string *)
                      &cmd.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (int *)(rccStdOut.field_2._M_local_buf + 8),pcVar3,OUTPUT_NONE,
                      (cmDuration)local_158,Auto);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_e8);
      if (((rccStdOut.field_2._M_local_buf[0xf] & 1U) == 0) || (rccStdOut.field_2._8_4_ != 0)) {
        std::__cxx11::string::operator=((string *)psStack_30,"The rcc list process failed for ");
        Quoted(&local_178,(string *)files_local);
        std::__cxx11::string::operator+=((string *)psStack_30,(string *)&local_178);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::operator+=((string *)psStack_30,"\n");
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) == 0) {
          std::__cxx11::string::operator+=
                    ((string *)psStack_30,(string *)(rccStdErr.field_2._M_local_buf + 8));
          std::__cxx11::string::operator+=((string *)psStack_30,"\n");
        }
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) == 0) {
          std::__cxx11::string::operator+=
                    ((string *)psStack_30,
                     (string *)
                     &cmd.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::operator+=((string *)psStack_30,"\n");
        }
        this_local._7_1_ = 0;
        qrcContents.field_2._12_4_ = 1;
      }
      else {
        bVar1 = RccListParseOutput((string *)((long)&rccStdErr.field_2 + 8),
                                   (string *)
                                   &cmd.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)error_local,psStack_30);
        if (bVar1) {
          qrcContents.field_2._12_4_ = 0;
        }
        else {
          this_local._7_1_ = 0;
          qrcContents.field_2._12_4_ = 1;
        }
      }
      std::__cxx11::string::~string
                ((string *)
                 &cmd.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)(rccStdErr.field_2._M_local_buf + 8));
      this_00 = error_local;
    }
    error_local = this_00;
    if (qrcContents.field_2._12_4_ == 0) {
      __end1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)this_00);
      entry = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&entry), bVar1) {
        local_580 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end1);
        cmsys::SystemTools::CollapseFullPath(&local_5a0,local_580,(string *)&retVal);
        std::__cxx11::string::operator=((string *)local_580,(string *)&local_5a0);
        std::__cxx11::string::~string((string *)&local_5a0);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      this_local._7_1_ = 1;
      qrcContents.field_2._12_4_ = 1;
    }
    std::__cxx11::string::~string((string *)&retVal);
  }
  else {
    std::__cxx11::string::operator=((string *)psStack_30,"The resource file ");
    Quoted(&local_58,(string *)files_local);
    std::__cxx11::string::operator+=((string *)psStack_30,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::operator+=((string *)psStack_30," does not exist.");
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmQtAutoGen::RccLister::list(std::string const& qrcFile,
                                  std::vector<std::string>& files,
                                  std::string& error, bool verbose) const
{
  error.clear();

  if (!cmSystemTools::FileExists(qrcFile, true)) {
    error = "The resource file ";
    error += Quoted(qrcFile);
    error += " does not exist.";
    return false;
  }

  // Run rcc list command in the directory of the qrc file with the pathless
  // qrc file name argument.  This way rcc prints relative paths.
  // This avoids issues on Windows when the qrc file is in a path that
  // contains non-ASCII characters.
  std::string const fileDir = cmSystemTools::GetFilenamePath(qrcFile);

  if (!this->RccExcutable_.empty() &&
      cmSystemTools::FileExists(this->RccExcutable_, true) &&
      !this->ListOptions_.empty()) {

    bool result = false;
    int retVal = 0;
    std::string rccStdOut;
    std::string rccStdErr;
    {
      std::vector<std::string> cmd;
      cmd.emplace_back(this->RccExcutable_);
      cmAppend(cmd, this->ListOptions_);
      cmd.emplace_back(cmSystemTools::GetFilenameName(qrcFile));

      // Log command
      if (verbose) {
        std::string msg = "Running command:\n";
        msg += QuotedCommand(cmd);
        msg += '\n';
        cmSystemTools::Stdout(msg);
      }

      result = cmSystemTools::RunSingleCommand(
        cmd, &rccStdOut, &rccStdErr, &retVal, fileDir.c_str(),
        cmSystemTools::OUTPUT_NONE, cmDuration::zero(), cmProcessOutput::Auto);
    }
    if (!result || retVal) {
      error = "The rcc list process failed for ";
      error += Quoted(qrcFile);
      error += "\n";
      if (!rccStdOut.empty()) {
        error += rccStdOut;
        error += "\n";
      }
      if (!rccStdErr.empty()) {
        error += rccStdErr;
        error += "\n";
      }
      return false;
    }
    if (!RccListParseOutput(rccStdOut, rccStdErr, files, error)) {
      return false;
    }
  } else {
    // We can't use rcc for the file listing.
    // Read the qrc file content into string and parse it.
    {
      std::string qrcContents;
      {
        cmsys::ifstream ifs(qrcFile.c_str());
        if (ifs) {
          std::ostringstream osst;
          osst << ifs.rdbuf();
          qrcContents = osst.str();
        } else {
          error = "The resource file ";
          error += Quoted(qrcFile);
          error += " is not readable\n";
          return false;
        }
      }
      // Parse string content
      RccListParseContent(qrcContents, files);
    }
  }

  // Convert relative paths to absolute paths
  for (std::string& entry : files) {
    entry = cmSystemTools::CollapseFullPath(entry, fileDir);
  }
  return true;
}